

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_vcproj.cpp
# Opt level: O2

void __thiscall VcprojGenerator::initWinDeployQtTool(VcprojGenerator *this)

{
  QMakeProject *pQVar1;
  bool bVar2;
  ProStringList *this_00;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_1b0 [2];
  QArrayDataPointer<char16_t> local_180;
  ProKey local_168;
  ProString local_138;
  QArrayDataPointer<char16_t> local_108;
  QArrayDataPointer<char16_t> local_f0;
  QArrayDataPointer<char16_t> local_d8;
  QArrayDataPointer<char16_t> local_b8;
  QStringBuilder<QString,_QLatin1Char> local_98;
  QStringBuilder<QStringBuilder<QString,_QLatin1Char>,_QString> local_78;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (this->vcProject).Configuration.windeployqt.ExcludedFromBuild = true;
  pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
  QString::QString((QString *)&local_78,"windeployqt");
  bVar2 = QMakeProject::isActiveConfig(pQVar1,(QString *)&local_78,false);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
  if (bVar2) {
    local_138.m_string.d.d = (Data *)0x0;
    local_138.m_string.d.ptr = (char16_t *)0x0;
    local_138.m_string.d.size = 0;
    local_78.a.a.d.d = (this->vcProject).Configuration.windeployqt.Record.d.d;
    local_78.a.a.d.ptr = (this->vcProject).Configuration.windeployqt.Record.d.ptr;
    (this->vcProject).Configuration.windeployqt.Record.d.d = (Data *)0x0;
    (this->vcProject).Configuration.windeployqt.Record.d.ptr =
         L"$(TargetName).windeployqt.$(Platform).$(Configuration)";
    local_78.a.a.d.size = (this->vcProject).Configuration.windeployqt.Record.d.size;
    (this->vcProject).Configuration.windeployqt.Record.d.size = 0x36;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_78);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_138);
    local_b8.size = -0x5555555555555556;
    local_b8.d = (Data *)0xaaaaaaaaaaaaaaaa;
    local_b8.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
    pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    ProKey::ProKey(&local_168,"QMAKE_WINDEPLOYQT");
    QMakeEvaluator::first(&local_138,&pQVar1->super_QMakeEvaluator,&local_168);
    ProString::toQString((QString *)&local_108,&local_138);
    QDir::toNativeSeparators((QString *)&local_f0);
    MakefileGenerator::shellQuote
              ((QString *)&local_d8,(MakefileGenerator *)this,(QString *)&local_f0);
    local_98.a.d.size = local_d8.size;
    local_98.a.d.ptr = local_d8.ptr;
    local_98.a.d.d = local_d8.d;
    local_d8.d = (Data *)0x0;
    local_d8.ptr = (char16_t *)0x0;
    local_d8.size = 0;
    local_98.b.ch = ' ';
    pQVar1 = (this->super_Win32MakefileGenerator).super_MakefileGenerator.project;
    ProKey::ProKey((ProKey *)local_1b0,"WINDEPLOYQT_OPTIONS");
    this_00 = QMakeEvaluator::valuesRef(&pQVar1->super_QMakeEvaluator,(ProKey *)local_1b0);
    ProStringList::join((QString *)&local_180,this_00,(QChar)0x20);
    QStringBuilder<QStringBuilder<QString,_QLatin1Char>,_QString>::QStringBuilder
              (&local_78,&local_98,(QString *)&local_180);
    QStringBuilder<QStringBuilder<QString,_QLatin1Char>,_QString>::convertTo<QString>
              ((QString *)&local_b8,&local_78);
    QStringBuilder<QStringBuilder<QString,_QLatin1Char>,_QString>::~QStringBuilder(&local_78);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_180);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(local_1b0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_108);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_138);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_168);
    local_1b0[0].d = (Data *)0x0;
    local_1b0[0].ptr = (char16_t *)0x0;
    local_1b0[0].size = 0;
    local_168.super_ProString.m_string.d.d = (Data *)0x0;
    local_138.m_string.d.ptr = (char16_t *)0x0;
    local_168.super_ProString.m_string.d.ptr = (char16_t *)0x0;
    local_168.super_ProString.m_string.d.size = 0;
    local_138.m_string.d.size = 0x222102;
    local_138.m_offset = 0x52;
    local_138.m_length = 0;
    local_138.m_string.d.d = (Data *)&local_b8;
    MakefileGenerator::shellQuote
              (&local_98.a,(MakefileGenerator *)this,
               &(this->vcProject).Configuration.windeployqt.Record);
    QStringBuilder<QStringBuilder<const_QString_&,_QString>,_QString>::QStringBuilder
              ((QStringBuilder<QStringBuilder<const_QString_&,_QString>,_QString> *)&local_78,
               (QStringBuilder<const_QString_&,_QString> *)&local_138,&local_98.a);
    ::operator+=(&(this->vcProject).Configuration.windeployqt.CommandLine,
                 (QStringBuilder<QStringBuilder<const_QString_&,_QString>,_QString> *)&local_78);
    QStringBuilder<QStringBuilder<const_QString_&,_QString>,_QString>::~QStringBuilder
              ((QStringBuilder<QStringBuilder<const_QString_&,_QString>,_QString> *)&local_78);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_98);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)&local_138.m_string.d.ptr);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_168);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(local_1b0);
    (this->vcProject).Configuration.windeployqt.config = &(this->vcProject).Configuration;
    (this->vcProject).Configuration.windeployqt.ExcludedFromBuild = false;
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void VcprojGenerator::initWinDeployQtTool()
{
    VCConfiguration &conf = vcProject.Configuration;
    conf.windeployqt.ExcludedFromBuild = true;
    if (project->isActiveConfig("windeployqt")) {
        conf.windeployqt.Record = QStringLiteral("$(TargetName).windeployqt.$(Platform).$(Configuration)");
        const QString commandLine = MakefileGenerator::shellQuote(QDir::toNativeSeparators(project->first("QMAKE_WINDEPLOYQT").toQString()))
                + QLatin1Char(' ') + project->values("WINDEPLOYQT_OPTIONS").join(QLatin1Char(' '));

        //  Visual Studio copies all files to be deployed into the MSIL directory
        //  and then invokes MDILXapCompile on it, which checks for managed code and
        //  translates it into native code. The problem is that all entries of the
        //  package will be copied into the MSIL directly, losing the subdirectory
        //  structure (for instance for plugins). However, the MDILXapCompile call
        //  itself contains the original subdirectories as parameters and hence the
        //  call fails.
        //  Hence the only way to get a build done is to recreate the directory
        //  structure manually by invoking windeployqt a second time, so that
        //  the MDILXapCompile call succeeds and deployment continues.
        conf.windeployqt.CommandLine += commandLine
                + QStringLiteral(" -list relative -dir \"$(MSBuildProjectDirectory)\" \"$(OutDir)\\$(TargetFileName)\" > ")
                + MakefileGenerator::shellQuote(conf.windeployqt.Record);
        conf.windeployqt.config = &vcProject.Configuration;
        conf.windeployqt.ExcludedFromBuild = false;
    }
}